

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitCall(BinaryInstWriter *this,Call *curr)

{
  U32LEB x;
  BufferWithRandomAccess *this_00;
  
  this_00 = BufferWithRandomAccess::operator<<(this->o,curr->isReturn * '\x02' + '\x10');
  x.value = WasmBinaryWriter::getFunctionIndex(this->parent,(Name)(curr->target).super_IString.str);
  BufferWithRandomAccess::operator<<(this_00,x);
  return;
}

Assistant:

void BinaryInstWriter::visitCall(Call* curr) {
  int8_t op =
    curr->isReturn ? BinaryConsts::RetCallFunction : BinaryConsts::CallFunction;
  o << op << U32LEB(parent.getFunctionIndex(curr->target));
}